

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O0

void ucnv_close_63(UConverter *converter)

{
  undefined1 local_88 [8];
  UConverterFromUnicodeArgs fromUArgs;
  UConverterToUnicodeArgs toUArgs;
  UErrorCode errorCode;
  UConverter *converter_local;
  
  toUArgs.offsets._4_4_ = 0;
  if (converter != (UConverter *)0x0) {
    if (converter->fromCharErrorBehaviour != UCNV_TO_U_CALLBACK_SUBSTITUTE_63) {
      memset(&fromUArgs.offsets,0,0x38);
      fromUArgs.offsets._0_2_ = 0x38;
      fromUArgs.offsets._2_1_ = 1;
      toUArgs.offsets._4_4_ = 0;
      toUArgs._0_8_ = converter;
      (*converter->fromCharErrorBehaviour)
                (converter->toUContext,(UConverterToUnicodeArgs *)&fromUArgs.offsets,(char *)0x0,0,
                 UCNV_CLOSE,(UErrorCode *)((long)&toUArgs.offsets + 4));
    }
    if (converter->fromUCharErrorBehaviour != UCNV_FROM_U_CALLBACK_SUBSTITUTE_63) {
      memset(local_88,0,0x38);
      local_88._0_2_ = 0x38;
      local_88[2] = '\x01';
      toUArgs.offsets._4_4_ = 0;
      fromUArgs._0_8_ = converter;
      (*converter->fromUCharErrorBehaviour)
                (converter->fromUContext,(UConverterFromUnicodeArgs *)local_88,(UChar *)0x0,0,0,
                 UCNV_CLOSE,(UErrorCode *)((long)&toUArgs.offsets + 4));
    }
    if (converter->sharedData->impl->close != (UConverterClose)0x0) {
      (*converter->sharedData->impl->close)(converter);
    }
    if ((UChar *)converter->subChars != converter->subUChars) {
      uprv_free_63(converter->subChars);
    }
    if (converter->sharedData->isReferenceCounted != '\0') {
      ucnv_unloadSharedDataIfReady_63(converter->sharedData);
    }
    if (converter->isCopyLocal == '\0') {
      uprv_free_63(converter);
    }
  }
  return;
}

Assistant:

U_CAPI void  U_EXPORT2
ucnv_close (UConverter * converter)
{
    UErrorCode errorCode = U_ZERO_ERROR;

    UTRACE_ENTRY_OC(UTRACE_UCNV_CLOSE);

    if (converter == NULL)
    {
        UTRACE_EXIT();
        return;
    }

    UTRACE_DATA3(UTRACE_OPEN_CLOSE, "close converter %s at %p, isCopyLocal=%b",
        ucnv_getName(converter, &errorCode), converter, converter->isCopyLocal);

    /* In order to speed up the close, only call the callbacks when they have been changed.
    This performance check will only work when the callbacks are set within a shared library
    or from user code that statically links this code. */
    /* first, notify the callback functions that the converter is closed */
    if (converter->fromCharErrorBehaviour != UCNV_TO_U_DEFAULT_CALLBACK) {
        UConverterToUnicodeArgs toUArgs = {
            sizeof(UConverterToUnicodeArgs),
                TRUE,
                NULL,
                NULL,
                NULL,
                NULL,
                NULL,
                NULL
        };

        toUArgs.converter = converter;
        errorCode = U_ZERO_ERROR;
        converter->fromCharErrorBehaviour(converter->toUContext, &toUArgs, NULL, 0, UCNV_CLOSE, &errorCode);
    }
    if (converter->fromUCharErrorBehaviour != UCNV_FROM_U_DEFAULT_CALLBACK) {
        UConverterFromUnicodeArgs fromUArgs = {
            sizeof(UConverterFromUnicodeArgs),
                TRUE,
                NULL,
                NULL,
                NULL,
                NULL,
                NULL,
                NULL
        };
        fromUArgs.converter = converter;
        errorCode = U_ZERO_ERROR;
        converter->fromUCharErrorBehaviour(converter->fromUContext, &fromUArgs, NULL, 0, 0, UCNV_CLOSE, &errorCode);
    }

    if (converter->sharedData->impl->close != NULL) {
        converter->sharedData->impl->close(converter);
    }

    if (converter->subChars != (uint8_t *)converter->subUChars) {
        uprv_free(converter->subChars);
    }

    if (converter->sharedData->isReferenceCounted) {
        ucnv_unloadSharedDataIfReady(converter->sharedData);
    }

    if(!converter->isCopyLocal){
        uprv_free(converter);
    }

    UTRACE_EXIT();
}